

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::VarSlice::VarSlice(VarSlice *this,Var *parent,uint32_t high,uint32_t low)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  pointer puVar1;
  undefined1 uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VarException *this_00;
  long *plVar6;
  undefined4 extraout_var_02;
  long lVar7;
  ulong uVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar9;
  basic_string_view<char> bVar10;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_a0;
  pointer local_98;
  pointer ppIStack_90;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  string local_60;
  allocator_type local_39;
  uint32_t local_38;
  undefined4 local_34;
  
  iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0xd])(parent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"",(allocator<char> *)&local_98);
  aVar9.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar3),&local_60,parent->var_width_,1
           ,false,Slice);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b1080;
  this->parent_var = parent;
  this->low = low;
  this->high = high;
  this->var_high_ = 0;
  this->var_low_ = 0;
  (this->op_).first = high;
  (this->op_).second = low;
  this->struct_ = (PackedStruct *)0x0;
  uVar4 = num_size_decrease(parent);
  local_38 = low;
  if (low == 0 && high == 0) {
    if (parent->type_ == Slice) {
      uVar5 = num_size_decrease((Var *)parent[1].super_IRNode._vptr_IRNode);
      local_34 = CONCAT31((int3)(uVar5 >> 8),uVar4 == uVar5);
    }
    else {
      local_34 = 0;
    }
    iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0xa8) -
               *(long *)(CONCAT44(extraout_var_00,iVar3) + 0xa0)) < 5) goto LAB_00173e9c;
    iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent);
    if ((char)local_34 != '\0' ||
        *(int *)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0xa8) + -4) != 1) goto LAB_00173e9c;
    iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x29])(parent);
    lVar7 = CONCAT44(extraout_var_02,iVar3);
    local_34 = (undefined4)
               CONCAT71((int7)((ulong)lVar7 >> 8),
                        (*(long *)(lVar7 + 0xa8) - *(long *)(lVar7 + 0xa0) >> 2) - 1U ==
                        (ulong)uVar4);
  }
  else {
LAB_00173e9c:
    local_34 = 0;
  }
  uVar4 = local_38;
  __first._M_current =
       (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__last._M_current - (long)__first._M_current == 4) {
    if (*__first._M_current == 1) {
      if (parent->explicit_array_ == true) {
        if (low != 0 || high != 0) {
          this_00 = (VarException *)__cxa_allocate_exception(0x10);
          (*(parent->super_IRNode)._vptr_IRNode[0x1f])(&local_98,parent);
          local_78.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = local_98;
          local_78.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppIStack_90;
          bVar10 = fmt::v7::to_string_view<char,_0>
                             (
                             "Parent {0} is a scalar but used marked as an explicit array, only [0, 0] allowed"
                             );
          format_str.data_ = (char *)bVar10.size_;
          format_str.size_ = 0xd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = aVar9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_78;
          fmt::v7::detail::vformat_abi_cxx11_(&local_60,(detail *)bVar10.data_,format_str,args);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_a0;
          local_a0 = parent;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_78,__l,&local_39);
          VarException::VarException(this_00,&local_60,&local_78);
          __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        if ((char)local_34 == '\0') {
          (this->super_Var).var_width_ = (high - local_38) + 1;
          iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
          uVar2 = (undefined1)iVar3;
          goto LAB_00174085;
        }
        if ((char)local_34 != '\x01') goto LAB_00173ff2;
        (this->super_Var).var_width_ = parent->var_width_;
        (this->super_Var).is_packed_ = true;
      }
    }
    else {
LAB_00173ff2:
      if (high != local_38) goto LAB_0017402d;
      local_60._M_dataplus._M_p._0_4_ = 1;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&(this->super_Var).size_,
                 &local_60);
      (this->super_Var).is_packed_ = true;
LAB_0017401d:
      (this->super_Var).var_width_ = parent->var_width_;
    }
  }
  else {
    if (high == local_38) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_60,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(__first._M_current + 1),__last,(allocator_type *)&local_98);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (&(this->super_Var).size_,&local_60);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
      iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
      (this->super_Var).is_packed_ = SUB41(iVar3,0);
      goto LAB_0017401d;
    }
LAB_0017402d:
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_60,__first,__last,
               (allocator_type *)&local_98);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&(this->super_Var).size_,&local_60);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
    (this->super_Var).size_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = (high - uVar4) + 1;
    (this->super_Var).var_width_ = parent->var_width_;
    iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
    uVar2 = (undefined1)iVar3;
LAB_00174085:
    (this->super_Var).is_packed_ = (bool)uVar2;
  }
  if (parent->type_ != Slice) {
    puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar7 = (long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if ((lVar7 == 4) && (*puVar1 == 1)) {
      if (parent->explicit_array_ != true) {
        this->var_low_ = local_38;
        goto LAB_00174275;
      }
      this->var_low_ = 0;
      uVar4 = (this->super_Var).var_width_;
    }
    else {
      uVar4 = parent->var_width_;
      for (uVar8 = 1; uVar8 < (ulong)(lVar7 >> 2); uVar8 = uVar8 + 1) {
        uVar4 = uVar4 * puVar1[uVar8];
      }
      this->var_low_ = local_38 * uVar4;
      uVar4 = (high + 1) * uVar4;
    }
    high = uVar4 - 1;
    goto LAB_00174275;
  }
  plVar6 = (long *)__dynamic_cast(parent,&Var::typeinfo,&typeinfo,0);
  puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar7 == 4) {
    if (*puVar1 == 1 && (char)local_34 == '\0') {
      iVar3 = (**(code **)(*plVar6 + 0x130))(plVar6);
      this->var_low_ = iVar3 + local_38;
      iVar3 = (**(code **)(*plVar6 + 0x130))(plVar6);
      high = high + iVar3;
      goto LAB_00174275;
    }
    if ((char)local_34 == '\x01' && *puVar1 == 1) {
      uVar4 = (**(code **)(*plVar6 + 0x130))(plVar6);
      this->var_low_ = uVar4;
      high = (**(code **)(*plVar6 + 0x128))(plVar6);
      goto LAB_00174275;
    }
  }
  uVar4 = parent->var_width_;
  for (uVar8 = 1; uVar8 < (ulong)(lVar7 >> 2); uVar8 = uVar8 + 1) {
    uVar4 = uVar4 * puVar1[uVar8];
  }
  iVar3 = (**(code **)(*plVar6 + 0x130))(plVar6);
  this->var_low_ = iVar3 + local_38 * uVar4;
  iVar3 = (**(code **)(*plVar6 + 0x130))(plVar6);
  high = (uVar4 * (high + 1) + iVar3) - 1;
LAB_00174275:
  this->var_high_ = high;
  return;
}

Assistant:

VarSlice::VarSlice(Var *parent, uint32_t high, uint32_t low)
    // variable slice is always unsigned based on the spec
    : Var(parent->generator(), "", parent->var_width(), 1, false, VarType::Slice),
      parent_var(parent),
      low(low),
      high(high),
      op_({high, low}) {
    // compute the width
    // notice that if the user has explicit set it to be an array
    // we need to honer their wish
    // we also need to honer the way the dimension the array is set
    auto diff = num_size_decrease(parent);
    auto diff_parent = true;
    if (low == 0 && high == 0 && parent->type() == VarType::Slice) {
        auto p_d = num_size_decrease(reinterpret_cast<VarSlice *>(parent)->parent_var);
        diff_parent = diff != p_d;
    }
    bool dropped_dim_size1 = low == 0 && high == 0 &&
                             parent->get_var_root_parent()->size().size() > 1 &&
                             parent->get_var_root_parent()->size().back() == 1 && diff_parent &&
                             diff == parent->get_var_root_parent()->size().size() - 1;
    if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
        if (high != 0 || low != 0) {
            throw VarException(::format("Parent {0} is a scalar but used marked as an explicit "
                                        "array, only [0, 0] allowed",
                                        parent->to_string()),
                               {parent});
        }
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
        // even it is true, we still need to make sure cases such as
        // [3:0][0:0] declaration (from size = (4, 1)), can be sliced twice before hitting
        // the wire, which means we need to count the number of size decreases
        // this is the actual slice
        var_width_ = high - low + 1;
        is_packed_ = parent->is_packed();
    } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
        // need to keep the var width calculation correct
        var_width_ = parent->var_width();
        is_packed_ = true;
    } else {
        if (high == low) {
            if (parent->size().size() == 1) {
                size_ = {1};
                is_packed_ = true;
            } else {
                size_ = std::vector<uint32_t>(parent->size().begin() + 1, parent->size().end());
                is_packed_ = parent->is_packed();
            }
            var_width_ = parent->var_width();
        } else {
            // readjust the top slice
            size_ = std::vector<uint32_t>(parent->size().begin(), parent->size().end());
            size_.back() = high - low + 1;
            var_width_ = parent->var_width();
            is_packed_ = parent->is_packed();
        }
    }
    // compute the var high and var_low
    if (parent->type() != VarType::Slice) {
        // use width to compute
        // honer user's wish
        if (parent->size().size() == 1 && parent->size().front() == 1 && parent->explicit_array()) {
            var_low_ = 0;
            var_high_ = var_width_ - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1) {
            var_low_ = low;
            var_high_ = high;
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = low * base_width;
            var_high_ = (high + 1) * base_width - 1;
        }
    } else {
        // it's a slice
        auto *slice = dynamic_cast<VarSlice *>(parent);
        if (parent->size().size() == 1 && parent->size().front() == 1 && !dropped_dim_size1) {
            var_low_ = low + slice->var_low();
            var_high_ = (high + 1) + slice->var_low() - 1;
        } else if (parent->size().size() == 1 && parent->size().front() == 1 && dropped_dim_size1) {
            var_low_ = slice->var_low();
            var_high_ = slice->var_high();
        } else {
            uint32_t base_width = parent->var_width();
            for (uint64_t i = 1; i < parent->size().size(); i++) base_width *= parent->size()[i];
            var_low_ = slice->var_low() + low * base_width;
            var_high_ = slice->var_low() + (high + 1) * base_width - 1;
        }
    }
}